

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Print.cpp
# Opt level: O1

void __thiscall
wasm::PrintExpressionContents::visitAtomicCmpxchg(PrintExpressionContents *this,AtomicCmpxchg *curr)

{
  byte bVar1;
  ostream *poVar2;
  uint uVar3;
  Module *in_R8;
  Name name;
  
  poVar2 = this->o;
  Colors::outputColorCode(poVar2,"\x1b[35m");
  Colors::outputColorCode(poVar2,"\x1b[1m");
  printRMWSize(this->o,(Type)(curr->super_SpecificExpression<(wasm::Expression::Id)25>).
                             super_Expression.type.id,curr->bytes);
  std::__ostream_insert<char,std::char_traits<char>>(this->o,"cmpxchg",7);
  if ((curr->super_SpecificExpression<(wasm::Expression::Id)25>).super_Expression.type.id != 1) {
    bVar1 = curr->bytes;
    uVar3 = wasm::Type::getByteSize
                      (&(curr->super_SpecificExpression<(wasm::Expression::Id)25>).super_Expression.
                        type);
    if (uVar3 != bVar1) {
      std::__ostream_insert<char,std::char_traits<char>>(this->o,"_u",2);
    }
  }
  Colors::outputColorCode(this->o,"\x1b[0m");
  name.super_IString.str._M_str = (char *)this->o;
  name.super_IString.str._M_len = (size_t)(curr->memory).super_IString.str._M_str;
  anon_unknown_0::printMemoryName
            ((anon_unknown_0 *)(curr->memory).super_IString.str._M_len,name,(ostream *)this->wasm,
             in_R8);
  if ((curr->offset).addr != 0) {
    poVar2 = this->o;
    std::__ostream_insert<char,std::char_traits<char>>(poVar2," offset=",8);
    std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
    return;
  }
  return;
}

Assistant:

void visitAtomicCmpxchg(AtomicCmpxchg* curr) {
    prepareColor(o);
    printRMWSize(o, curr->type, curr->bytes);
    o << "cmpxchg";
    if (curr->type != Type::unreachable &&
        curr->bytes != curr->type.getByteSize()) {
      o << "_u";
    }
    restoreNormalColor(o);
    printMemoryName(curr->memory, o, wasm);
    if (curr->offset) {
      o << " offset=" << curr->offset;
    }
  }